

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode Curl_http2_request_upgrade(dynbuf *req,Curl_easy *data)

{
  connectdata *pcVar1;
  http_conn *httpc;
  uint8_t *binsettings;
  SingleRequest *k;
  connectdata *conn;
  size_t blen;
  char *base64;
  ssize_t binlen;
  Curl_easy *pCStack_20;
  CURLcode result;
  Curl_easy *data_local;
  dynbuf *req_local;
  
  pcVar1 = data->conn;
  pCStack_20 = data;
  data_local = (Curl_easy *)req;
  populate_settings(data,&(pcVar1->proto).httpc);
  base64 = (char *)nghttp2_pack_settings_payload
                             ((uint8_t *)&pcVar1->proto,0x50,(pcVar1->proto).httpc.local_settings,
                              (pcVar1->proto).httpc.local_settings_num);
  if ((long)base64 < 1) {
    Curl_failf(pCStack_20,"nghttp2 unexpectedly failed on pack_settings_payload");
    Curl_dyn_free((dynbuf *)data_local);
    req_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    (pcVar1->proto).ftpc.pp.response_time = (timediff_t)base64;
    binlen._4_4_ = Curl_base64url_encode
                             ((char *)&pcVar1->proto,(size_t)base64,(char **)&blen,(size_t *)&conn);
    if (binlen._4_4_ == CURLE_OK) {
      binlen._4_4_ = Curl_dyn_addf((dynbuf *)data_local,
                                   "Connection: Upgrade, HTTP2-Settings\r\nUpgrade: %s\r\nHTTP2-Settings: %s\r\n"
                                   ,"h2c",blen);
      (*Curl_cfree)((void *)blen);
      (data->req).upgr101 = UPGR101_H2;
      req_local._4_4_ = binlen._4_4_;
    }
    else {
      Curl_dyn_free((dynbuf *)data_local);
      req_local._4_4_ = binlen._4_4_;
    }
  }
  return req_local._4_4_;
}

Assistant:

CURLcode Curl_http2_request_upgrade(struct dynbuf *req,
                                    struct Curl_easy *data)
{
  CURLcode result;
  ssize_t binlen;
  char *base64;
  size_t blen;
  struct connectdata *conn = data->conn;
  struct SingleRequest *k = &data->req;
  uint8_t *binsettings = conn->proto.httpc.binsettings;
  struct http_conn *httpc = &conn->proto.httpc;

  populate_settings(data, httpc);

  /* this returns number of bytes it wrote */
  binlen = nghttp2_pack_settings_payload(binsettings, H2_BINSETTINGS_LEN,
                                         httpc->local_settings,
                                         httpc->local_settings_num);
  if(binlen <= 0) {
    failf(data, "nghttp2 unexpectedly failed on pack_settings_payload");
    Curl_dyn_free(req);
    return CURLE_FAILED_INIT;
  }
  conn->proto.httpc.binlen = binlen;

  result = Curl_base64url_encode((const char *)binsettings, binlen,
                                 &base64, &blen);
  if(result) {
    Curl_dyn_free(req);
    return result;
  }

  result = Curl_dyn_addf(req,
                         "Connection: Upgrade, HTTP2-Settings\r\n"
                         "Upgrade: %s\r\n"
                         "HTTP2-Settings: %s\r\n",
                         NGHTTP2_CLEARTEXT_PROTO_VERSION_ID, base64);
  free(base64);

  k->upgr101 = UPGR101_H2;

  return result;
}